

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

void duckdb_result_arrow_array
               (duckdb_result result,duckdb_data_chunk chunk,duckdb_arrow_array *out_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClientContext *context;
  ArrowArray *out_array_00;
  pointer pcVar2;
  pointer pQVar3;
  ClientProperties local_88;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  if (out_array != (duckdb_arrow_array *)0x0) {
    pQVar3 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    duckdb::optional_ptr<duckdb::ClientContext,_true>::CheckValid
              (&(pQVar3->client_properties).client_context);
    context = (pQVar3->client_properties).client_context.ptr;
    pQVar3 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    duckdb::ArrowTypeExtensionData::GetExtensionTypes
              ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *)&local_58,context,&(pQVar3->super_BaseQueryResult).types);
    out_array_00 = (ArrowArray *)*out_array;
    pQVar3 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data);
    paVar1 = &local_88.time_zone.field_2;
    pcVar2 = (pQVar3->client_properties).time_zone._M_dataplus._M_p;
    local_88.time_zone._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,
               pcVar2 + (pQVar3->client_properties).time_zone._M_string_length);
    local_88.arrow_offset_size = (pQVar3->client_properties).arrow_offset_size;
    local_88.arrow_use_list_view = (pQVar3->client_properties).arrow_use_list_view;
    local_88.produce_arrow_string_view = (pQVar3->client_properties).produce_arrow_string_view;
    local_88.arrow_lossless_conversion = (pQVar3->client_properties).arrow_lossless_conversion;
    local_88._36_4_ = *(undefined4 *)&(pQVar3->client_properties).field_0x24;
    local_88.client_context.ptr = (pQVar3->client_properties).client_context.ptr;
    duckdb::ArrowConverter::ToArrowArray
              ((DataChunk *)chunk,out_array_00,&local_88,
               (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.time_zone._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.time_zone._M_dataplus._M_p);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58);
  }
  return;
}

Assistant:

void duckdb_result_arrow_array(duckdb_result result, duckdb_data_chunk chunk, duckdb_arrow_array *out_array) {
	if (!out_array) {
		return;
	}
	auto dchunk = reinterpret_cast<duckdb::DataChunk *>(chunk);
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	auto extension_type_cast = duckdb::ArrowTypeExtensionData::GetExtensionTypes(
	    *result_data.result->client_properties.client_context, result_data.result->types);

	ArrowConverter::ToArrowArray(*dchunk, reinterpret_cast<ArrowArray *>(*out_array),
	                             result_data.result->client_properties, extension_type_cast);
}